

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

UniquePtr<SDL_Window> * __thiscall
solitaire::graphics::SDLGraphicsSystem::createSDLWindowOrQuitAndThrowError
          (UniquePtr<SDL_Window> *__return_storage_ptr__,SDLGraphicsSystem *this,string *title,
          uint width,uint height)

{
  bool bVar1;
  pointer pWVar2;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  uint local_28;
  uint local_24;
  uint height_local;
  uint width_local;
  string *title_local;
  SDLGraphicsSystem *this_local;
  UniquePtr<SDL_Window> *window;
  
  local_29 = 0;
  local_28 = height;
  local_24 = width;
  _height_local = title;
  title_local = (string *)this;
  this_local = (SDLGraphicsSystem *)__return_storage_ptr__;
  pWVar2 = std::
           unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ::operator->(&this->sdl);
  (*pWVar2->_vptr_Wrapper[5])
            (__return_storage_ptr__,pWVar2,_height_local,0x1fff0000,0x1fff0000,(ulong)local_24,
             local_28,4);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)__return_storage_ptr__);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Cannot create window",&local_51);
    quitAndThrow(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Window> SDLGraphicsSystem::createSDLWindowOrQuitAndThrowError(
    const std::string& title, const unsigned width, const unsigned height)
{
    auto window = sdl->createWindow(
        title, SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED,
        width, height, SDL_WINDOW_SHOWN
    );

    if (not window)
        quitAndThrow("Cannot create window");
    return window;
}